

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

int __thiscall smf::Options::define(Options *this,string *aDefinition)

{
  pointer *pppOVar1;
  byte *pbVar2;
  byte bVar3;
  char cVar4;
  iterator __position;
  bool bVar5;
  int iVar6;
  long lVar7;
  Option_register *this_00;
  ulong uVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  ostream *poVar11;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  string optionName;
  string otype;
  Option_register *definitionEntry;
  string ovalue;
  string rest;
  string aliases;
  key_type local_100;
  ulong local_e0;
  byte *local_d8;
  ulong local_d0;
  byte local_c8 [16];
  Option_register *local_b8;
  string local_b0;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  string local_50;
  
  local_b8 = (Option_register *)0x0;
  lVar7 = std::__cxx11::string::find((char *)aDefinition,0x131c47,0);
  if (lVar7 == -1) {
    poVar11 = std::operator<<((ostream *)&std::cerr,"Error: no \"=\" in option definition: ");
    poVar11 = std::operator<<(poVar11,(string *)aDefinition);
    std::endl<char,std::char_traits<char>>(poVar11);
    goto LAB_0011f905;
  }
  std::__cxx11::string::substr((ulong)&local_70,(ulong)aDefinition);
  std::__cxx11::string::substr((ulong)&local_90,(ulong)aDefinition);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_90,local_90 + local_88);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  lVar7 = std::__cxx11::string::find((char *)&local_90,0x130359,0);
  if (lVar7 != -1) {
    std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_90);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_100);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
  }
  pbVar2 = local_d8 + local_d0;
  pbVar13 = local_d8;
  if (0 < (long)local_d0 >> 2) {
    pbVar13 = local_d8 + (local_d0 & 0xfffffffffffffffc);
    lVar7 = ((long)local_d0 >> 2) + 1;
    pbVar12 = local_d8 + 3;
    do {
      iVar6 = isspace((int)(char)pbVar12[-3]);
      if (iVar6 != 0) {
        pbVar12 = pbVar12 + -3;
        goto LAB_0011f5ab;
      }
      iVar6 = isspace((int)(char)pbVar12[-2]);
      if (iVar6 != 0) {
        pbVar12 = pbVar12 + -2;
        goto LAB_0011f5ab;
      }
      iVar6 = isspace((int)(char)pbVar12[-1]);
      if (iVar6 != 0) {
        pbVar12 = pbVar12 + -1;
        goto LAB_0011f5ab;
      }
      iVar6 = isspace((int)(char)*pbVar12);
      if (iVar6 != 0) goto LAB_0011f5ab;
      lVar7 = lVar7 + -1;
      pbVar12 = pbVar12 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pbVar2 - (long)pbVar13;
  if (lVar7 == 1) {
LAB_0011f587:
    iVar6 = isspace((int)(char)*pbVar13);
    pbVar12 = pbVar13;
    if (iVar6 == 0) {
      pbVar12 = pbVar2;
    }
  }
  else if (lVar7 == 2) {
LAB_0011f576:
    iVar6 = isspace((int)(char)*pbVar13);
    pbVar12 = pbVar13;
    if (iVar6 == 0) {
      pbVar13 = pbVar13 + 1;
      goto LAB_0011f587;
    }
  }
  else {
    pbVar12 = pbVar2;
    if ((lVar7 == 3) && (iVar6 = isspace((int)(char)*pbVar13), pbVar12 = pbVar13, iVar6 == 0)) {
      pbVar13 = pbVar13 + 1;
      goto LAB_0011f576;
    }
  }
LAB_0011f5ab:
  pbVar13 = pbVar12 + 1;
  if (pbVar13 != pbVar2 && pbVar12 != pbVar2) {
    do {
      bVar3 = *pbVar13;
      iVar6 = isspace((int)(char)bVar3);
      if (iVar6 == 0) {
        *pbVar12 = bVar3;
        pbVar12 = pbVar12 + 1;
      }
      pbVar13 = pbVar13 + 1;
    } while (pbVar13 != pbVar2);
  }
  pbVar2 = local_d8;
  local_d0 = (long)pbVar12 - (long)local_d8;
  *pbVar12 = 0;
  if (local_d0 == 1) {
    if ((*local_d8 - 0x62 < 0x12) && ((0x20097U >> (*local_d8 - 0x62 & 0x1f) & 1) != 0)) {
      this_00 = (Option_register *)operator_new(0x88);
      Option_register::Option_register(this_00,aDefinition,*pbVar2,&local_b0);
      local_e0 = (long)(this->m_optionRegister).
                       super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_optionRegister).
                       super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      local_100._M_string_length = 0;
      local_100.field_2._M_local_buf[0] = '\0';
      local_b8 = this_00;
      std::__cxx11::string::push_back((char)&local_70);
      local_e0 = local_e0 >> 3;
      if (local_68 != 0) {
        uVar8 = 0;
        uVar14 = 1;
        do {
          cVar4 = local_70[uVar8];
          iVar6 = isspace((int)cVar4);
          if (iVar6 == 0) {
            if (cVar4 == '|') {
              iVar9 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&(this->m_optionList)._M_t,&local_100);
              if ((_Rb_tree_header *)iVar9._M_node !=
                  &(this->m_optionList)._M_t._M_impl.super__Rb_tree_header) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Option \"",8);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_100._M_dataplus._M_p,
                                     local_100._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" from definition:",0x12);
                std::endl<char,std::char_traits<char>>(poVar11);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(aDefinition->_M_dataplus)._M_p,
                                     aDefinition->_M_string_length);
                std::endl<char,std::char_traits<char>>(poVar11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"is already defined in: ",0x17);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\t",1);
                getDefinition(&local_50,this,&local_100);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_50._M_dataplus._M_p,
                                     local_50._M_string_length);
                std::endl<char,std::char_traits<char>>(poVar11);
                std::__cxx11::string::~string((string *)&local_50);
                goto LAB_0011f905;
              }
              if (local_100._M_string_length != 0) {
                pmVar10 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                          ::operator[](&this->m_optionList,&local_100);
                *pmVar10 = (mapped_type)local_e0;
              }
              local_100._M_string_length = 0;
              *local_100._M_dataplus._M_p = '\0';
            }
            else {
              std::__cxx11::string::push_back('\0');
            }
          }
          bVar5 = uVar14 < local_68;
          uVar8 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar5);
      }
      __position._M_current =
           (this->m_optionRegister).
           super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_optionRegister).
          super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<smf::Option_register*,std::allocator<smf::Option_register*>>::
        _M_realloc_insert<smf::Option_register*const&>
                  ((vector<smf::Option_register*,std::allocator<smf::Option_register*>> *)
                   &this->m_optionRegister,__position,&local_b8);
      }
      else {
        *__position._M_current = local_b8;
        pppOVar1 = &(this->m_optionRegister).
                    super__Vector_base<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppOVar1 = *pppOVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
      }
      if (local_90 != local_80) {
        operator_delete(local_90);
      }
      if (local_70 != local_60) {
        operator_delete(local_70);
      }
      return (int)local_e0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: unknown option type \'",0x1c);
    local_100._M_dataplus._M_p._0_1_ = *local_d8;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)&local_100,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\' in defintion: ",0x10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(aDefinition->_M_dataplus)._M_p,aDefinition->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar11);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: option type is invalid: ",0x1f);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_d8,local_d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," in option definition: ",0x17);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(aDefinition->_M_dataplus)._M_p,aDefinition->_M_string_length);
    std::endl<char,std::char_traits<char>>(poVar11);
  }
LAB_0011f905:
  exit(1);
}

Assistant:

int Options::define(const std::string& aDefinition) {
   Option_register* definitionEntry = NULL;

   // Error if definition string doesn't contain an equals sign
   auto location = aDefinition.find("=");
   if (location == std::string::npos) {
      std::cerr << "Error: no \"=\" in option definition: " << aDefinition << std::endl;
      exit(1);
   }

   std::string aliases = aDefinition.substr(0, location);
   std::string rest    = aDefinition.substr(location+1);
   std::string otype   = rest;
   std::string ovalue  = "";

   location = rest.find(":");
   if (location != std::string::npos) {
      otype  = rest.substr(0, location);
      ovalue = rest.substr(location+1);
   }

   // Remove anyspaces in the option type field
   otype.erase(remove_if(otype.begin(), otype.end(), ::isspace), otype.end());

   // Option types are only a single charater (b, i, d, c or s)
   if (otype.size() != 1) {
      std::cerr << "Error: option type is invalid: " << otype
           << " in option definition: " << aDefinition << std::endl;
      exit(1);
   }

   // Check to make sure that the type is known
   if (otype[0] != OPTION_STRING_TYPE  &&
       otype[0] != OPTION_INT_TYPE     &&
       otype[0] != OPTION_FLOAT_TYPE   &&
       otype[0] != OPTION_DOUBLE_TYPE  &&
       otype[0] != OPTION_BOOLEAN_TYPE &&
       otype[0] != OPTION_CHAR_TYPE ) {
      std::cerr << "Error: unknown option type \'" << otype[0]
           << "\' in defintion: " << aDefinition << std::endl;
      exit(1);
   }

   // Set up space for a option entry in the registry
   definitionEntry = new Option_register(aDefinition, otype[0], ovalue);

   int definitionIndex = (int)m_optionRegister.size();

   // Store option aliases
   std::string optionName;
   unsigned int i;
   aliases += '|';
   for (i=0; i<aliases.size(); i++) {
      if (::isspace(aliases[i])) {
         continue;
      } else if (aliases[i] == '|') {
         if (isDefined(optionName)) {
            std::cerr << "Option \"" << optionName << "\" from definition:" << std::endl;
            std::cerr << "\t" << aDefinition << std::endl;
            std::cerr << "is already defined in: " << std::endl;
            std::cerr << "\t" << getDefinition(optionName) << std::endl;
            exit(1);
         }
         if (optionName.size() > 0) {
            m_optionList[optionName] = definitionIndex;
         }
         optionName.clear();
      } else {
         optionName += aliases[i];
      }
   }

   // Store definition in registry and return its indexed location.
   // This location will be used to link option aliases to the main
   // command name.
   m_optionRegister.push_back(definitionEntry);
   return definitionIndex;
}